

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O1

bool __thiscall ON_Mesh::InsertNgon(ON_Mesh *this,uint ngon_index,ON_MeshNgon *ngon)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  ON_MeshNgon *local_30;
  
  if (ngon_index != 0xffffffff) {
    if (ngon_index < (uint)(this->m_Ngon).m_count) {
      iVar1 = (this->m_NgonMap).m_count;
      iVar2 = (this->m_F).m_count;
      local_30 = (ON_MeshNgon *)0x0;
      ON_SimpleArray<ON_MeshNgon_*>::Insert(&this->m_Ngon,ngon_index,&local_30);
      if (iVar1 == iVar2) {
        CreateNgonMap(this,&this->m_NgonMap);
      }
    }
    else {
      SetNgonCount(this,ngon_index + 1);
    }
    bVar3 = ModifyNgon(this,ngon_index,ngon);
    return bVar3;
  }
  return false;
}

Assistant:

bool ON_Mesh::InsertNgon(
  unsigned int ngon_index,
  const ON_MeshNgon* ngon
  )
{
  if ( ngon_index >= ON_UNSET_UINT_INDEX )
    return false;

  if ( ngon_index >= m_Ngon.UnsignedCount() )
  {
    SetNgonCount(ngon_index+1);
  }
  else
  {
    bool bUpdateNgonMap = (m_NgonMap.UnsignedCount() == m_F.UnsignedCount());
    m_Ngon.Insert(ngon_index,0);
    if (bUpdateNgonMap)
      CreateNgonMap();
  }
  return ModifyNgon(ngon_index,ngon);
}